

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

bool fmt::v8::detail::dragonbox::cache_accessor<double>::compute_mul_parity
               (carrier_uint two_f,cache_entry_type *cache,int beta_minus_1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  if (beta_minus_1 < 1) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                ,0x749,"");
  }
  if ((uint)beta_minus_1 < 0x40) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = two_f;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (ulong)cache->internal_;
    return (SUB168(auVar1 * auVar2,8) + *(long *)((long)&cache->internal_ + 8) * two_f >>
            ((ulong)(byte)(0x40 - (char)beta_minus_1) & 0x3f) & 1) != 0;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
              ,0x74a,"");
}

Assistant:

static bool compute_mul_parity(carrier_uint two_f,
                                 const cache_entry_type& cache,
                                 int beta_minus_1) FMT_NOEXCEPT {
    FMT_ASSERT(beta_minus_1 >= 1, "");
    FMT_ASSERT(beta_minus_1 < 64, "");

    return ((umul192_middle64(two_f, cache) >> (64 - beta_minus_1)) & 1) != 0;
  }